

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O2

void __thiscall
iDynTree::PrismaticJoint::computeChildVelAcc
          (PrismaticJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,VectorDynSize *jntAcc,
          LinkVelArray *linkVels,LinkAccArray *linkAccs,LinkIndex child,LinkIndex parent)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Twist *pTVar2;
  SpatialAcc *this_00;
  double dVar3;
  double dVar4;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Twist local_1e0 [48];
  SpatialAcc local_1b0;
  SpatialAcc local_180;
  SpatialMotionVector local_150;
  undefined1 local_120 [48];
  Twist local_f0 [48];
  Twist local_c0 [48];
  SpatialMotionVector local_90;
  SpatialAcc local_60;
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])();
  dVar3 = (double)iDynTree::VectorDynSize::operator()(jntVel,CONCAT44(extraout_var,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x18])(this);
  dVar4 = (double)iDynTree::VectorDynSize::operator()(jntAcc,CONCAT44(extraout_var_00,iVar1));
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[10])(this,jntPos,child,parent)
  ;
  (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0xc])
            (local_120,this,0,child,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_150,dVar3);
  LinkVelArray::operator()(linkVels,parent);
  iDynTree::Transform::operator*((Transform *)&local_1b0,(Twist *)CONCAT44(extraout_var_01,iVar1));
  iDynTree::Twist::Twist(local_1e0,&local_150);
  iDynTree::Twist::operator+((Twist *)&local_180,(Twist *)&local_1b0);
  pTVar2 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::operator=(pTVar2,(Twist *)&local_180);
  LinkAccArray::operator()(linkAccs,parent);
  iDynTree::Transform::operator*
            ((Transform *)local_1e0,(SpatialAcc *)CONCAT44(extraout_var_01,iVar1));
  iDynTree::SpatialMotionVector::operator*(&local_90,dVar4);
  iDynTree::SpatialAcc::SpatialAcc(&local_60,&local_90);
  iDynTree::SpatialAcc::operator+(&local_1b0,(SpatialAcc *)local_1e0);
  pTVar2 = LinkVelArray::operator()(linkVels,child);
  iDynTree::Twist::Twist(local_f0,&local_150);
  iDynTree::Twist::operator*(local_c0,pTVar2);
  iDynTree::SpatialAcc::operator+(&local_180,&local_1b0);
  this_00 = LinkAccArray::operator()(linkAccs,child);
  iDynTree::SpatialAcc::operator=(this_00,&local_180);
  return;
}

Assistant:

void PrismaticJoint::computeChildVelAcc(const VectorDynSize & jntPos,
                                       const VectorDynSize & jntVel,
                                       const VectorDynSize & jntAcc,
                                       LinkVelArray & linkVels,
                                       LinkAccArray & linkAccs,
                                       const LinkIndex child, const LinkIndex parent) const
{
    double ddist = jntVel(this->getDOFsOffset());
    double d2dist = jntAcc(this->getDOFsOffset());

    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);

    // Propagate twist and spatial acceleration: for a prismatic joint (as for any 1 dof joint)
    // we implement equation 5.14 and 5.15 of Feathestone RBDA, 2008
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);

    SpatialMotionVector vj = S*ddist;
    linkVels(child) = child_X_parent*linkVels(parent) + vj;
    linkAccs(child) = child_X_parent*linkAccs(parent) + S*d2dist + linkVels(child)*vj;

    return;
}